

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_nws_image.cc
# Opt level: O3

void __thiscall
NWSImageHandler::NWSImageHandler
          (NWSImageHandler *this,Handler *config,shared_ptr<FileWriter> *fileWriter)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Handler)._vptr_Handler = (_func_int **)&PTR_handle_001e1120;
  Config::Handler::Handler(&this->config_,config);
  (this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fileWriter->super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (fileWriter->super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

NWSImageHandler::NWSImageHandler(
  const Config::Handler& config,
  const std::shared_ptr<FileWriter>& fileWriter)
  : config_(config),
    fileWriter_(fileWriter) {
}